

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void finalize_script_execute_command
               (Am_Object *script_window,Am_Object *undo_db,Am_Object *window,bool register_show)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Object match_command;
  Am_Object script_execute_command;
  Am_String name;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_String local_28;
  
  pAVar2 = Am_Object::Get(script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_30,pAVar2);
  Am_Object::Get_Object(&AStack_38,(Am_Slot_Key)script_window,(ulong)Am_NAME_OBJECT);
  pAVar2 = Am_Object::Get(&AStack_38,0x169,0);
  Am_String::Am_String(&local_28,pAVar2);
  Am_Object::~Am_Object(&AStack_38);
  this = Am_Object::Set(&local_30,0x150,&local_28,0);
  Am_Object::Set(this,Am_EXECUTE_SCRIPT_ON_NEW,false,0);
  if (register_show) {
    register_script_command(&local_30,window,undo_db,&local_28);
  }
  pAVar2 = Am_Object::Get(&local_30,Am_BEFORE_OR_AFTER_COMMAND,3);
  Am_Object::Am_Object(&AStack_38,pAVar2);
  bVar1 = Am_Object::Valid(&AStack_38);
  if (bVar1) {
    am_install_match_command(&AStack_38,&local_30);
  }
  Am_Object::~Am_Object(&AStack_38);
  Am_String::~Am_String(&local_28);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void
finalize_script_execute_command(Am_Object &script_window, Am_Object &undo_db,
                                Am_Object &window, bool register_show)
{
  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_String name = script_window.Get_Object(Am_NAME_OBJECT).Get(Am_VALUE);
  script_execute_command
      .Set(Am_LABEL, name)
      // accelerator of execute command set directly by invoke.cc
      // .Set(Am_ACCELERATOR, accel_char)
      .Set(Am_EXECUTE_SCRIPT_ON_NEW, false);
  if (register_show)
    register_script_command(script_execute_command, window, undo_db, name);

  Am_Object match_command = script_execute_command.Get(
      Am_BEFORE_OR_AFTER_COMMAND, Am_RETURN_ZERO_ON_ERROR);
  if (match_command.Valid())
    am_install_match_command(match_command, script_execute_command);
}